

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::ZConsVisitor::visit(ZConsVisitor *this,RigidBody *rb)

{
  bool bVar1;
  string prefix;
  string local_68;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_48;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector(&local_48,&rb->atoms_);
  bVar1 = isZconstraint(this,((*local_48.
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_start)->super_StuntDouble).
                             globalIndex_,&local_68);
  if (bVar1) {
    internalVisit(this,&rb->super_StuntDouble,&local_68);
  }
  operator_delete(local_48.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ZConsVisitor::visit(RigidBody* rb) {
    std::string prefix;
    std::vector<Atom*> atoms;

    atoms = rb->getAtoms();

    if (isZconstraint(atoms[0]->getGlobalIndex(), prefix))
      internalVisit(rb, prefix);
  }